

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel.h
# Opt level: O3

string * __thiscall
Dashel::Stream::getTargetName_abi_cxx11_(string *__return_storage_ptr__,Stream *this)

{
  size_type *psVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  ulong uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  ulong *local_60;
  long local_58;
  ulong local_50 [2];
  ulong *local_40;
  long local_38;
  ulong local_30 [2];
  
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,*(long *)(this + 0x78),
             *(long *)(this + 0x80) + *(long *)(this + 0x78));
  std::__cxx11::string::append((char *)&local_60);
  Dashel::ParameterSet::getString_abi_cxx11_();
  uVar4 = 0xf;
  if (local_60 != local_50) {
    uVar4 = local_50[0];
  }
  if (uVar4 < (ulong)(local_38 + local_58)) {
    uVar4 = 0xf;
    if (local_40 != local_30) {
      uVar4 = local_30[0];
    }
    if ((ulong)(local_38 + local_58) <= uVar4) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_40,0,(char *)0x0,(ulong)local_60);
      goto LAB_00102a49;
    }
  }
  puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_60,(ulong)local_40);
LAB_00102a49:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar3 + 2;
  if ((size_type *)*puVar3 == psVar1) {
    uVar2 = puVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar3[1];
  *puVar3 = psVar1;
  puVar3[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getTargetName() const { return protocolName + ":" + target.getString(); }